

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O3

int login(string *cmd,int socket_fd,string *currUser,
         vector<cUser,_std::allocator<cUser>_> *currUsers,int id,bool *msgFlags,
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *msgs)

{
  string *psVar1;
  pointer paVar2;
  pointer pcVar3;
  uint uVar4;
  size_type *psVar5;
  bool bVar6;
  ssize_t sVar7;
  ostream *poVar8;
  int iVar9;
  undefined8 uVar10;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> __it;
  long lVar11;
  size_type *psVar12;
  pointer paVar13;
  long lVar14;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> __it_00;
  vector<cUser,_std::allocator<cUser>_> *pvVar15;
  __normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_> _Var16;
  undefined1 *local_1e0;
  long local_1d8;
  undefined1 local_1d0 [16];
  undefined1 *local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  size_type *local_1a0;
  string password;
  vector<User,_std::allocator<User>_> users;
  long local_160;
  undefined1 local_158 [32];
  _Alloc_hider local_138;
  string username;
  size_type local_108 [2];
  uint *local_f8;
  long local_f0;
  uint local_e8 [2];
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  int local_d4;
  size_type *local_d0;
  size_type *local_c8;
  long local_c0;
  uint local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  uint *local_a8;
  long local_a0;
  uint local_98 [2];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  int local_84;
  anon_struct_64_2_84df61a8 *local_80;
  undefined1 local_78 [8];
  cUser user;
  uint local_48 [2];
  undefined4 uStack_40;
  undefined4 uStack_3c;
  vector<cUser,_std::allocator<cUser>_> *local_38;
  
  local_138._M_p = (pointer)&username._M_string_length;
  username._M_dataplus._M_p = (pointer)0x0;
  username._M_string_length._0_1_ = 0;
  local_1a0 = &password._M_string_length;
  password._M_dataplus._M_p = (pointer)0x0;
  password._M_string_length._0_1_ = 0;
  local_158._16_8_ = msgFlags;
  local_84 = socket_fd;
  local_38 = currUsers;
  getUsers();
  std::__cxx11::string::find((char *)cmd,0x1091e5,0);
  std::__cxx11::string::substr((ulong)local_78,(ulong)cmd);
  std::__cxx11::string::operator=((string *)&local_138,(string *)local_78);
  psVar12 = &user.username._M_string_length;
  if (local_78 != (undefined1  [8])psVar12) {
    operator_delete((void *)local_78);
  }
  std::__cxx11::string::substr((ulong)local_78,(ulong)cmd);
  std::__cxx11::string::operator=((string *)&local_1a0,(string *)local_78);
  if (local_78 != (undefined1  [8])psVar12) {
    operator_delete((void *)local_78);
  }
  local_80 = users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
             _M_start;
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,local_138._M_p,username._M_dataplus._M_p + local_138._M_p);
  local_1c0 = local_1b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,local_1a0,password._M_dataplus._M_p + (long)local_1a0);
  local_c8 = (size_type *)&local_b8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_1e0,local_1e0 + local_1d8);
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a8,local_1c0,local_1c0 + local_1b8);
  local_f0 = local_a0;
  uVar4 = local_b8;
  lVar11 = local_c0;
  if (local_c8 == (size_type *)&local_b8) {
    user.username.field_2._M_allocated_capacity._4_4_ = uStack_ac;
    user.username.field_2._M_allocated_capacity._0_4_ = uStack_b0;
    local_c8 = psVar12;
  }
  user.username._M_string_length = CONCAT44(uStack_b4,local_b8);
  local_c0 = 0;
  local_b8 = local_b8 & 0xffffff00;
  if (local_a8 == local_98) {
    uStack_40 = uStack_90;
    uStack_3c = uStack_8c;
    local_a8 = local_48;
  }
  local_a0 = 0;
  local_98[0] = local_98[0] & 0xffffff00;
  username.field_2._8_8_ = local_108;
  if (local_c8 == psVar12) {
    local_108[0] = CONCAT44(uStack_b4,uVar4);
  }
  else {
    local_108[0] = user.username._M_string_length;
    username.field_2._8_8_ = local_c8;
  }
  local_f8 = local_a8;
  if (local_a8 == local_48) {
    uStack_e0 = uStack_40;
    uStack_dc = uStack_3c;
    local_f8 = local_e8;
  }
  local_78 = (undefined1  [8])&user.username._M_string_length;
  local_c8 = (size_type *)&local_b8;
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,username.field_2._8_8_,
             (undefined1 *)(lVar11 + username.field_2._8_8_));
  user.username.field_2._8_8_ = local_48;
  local_158._24_8_ = currUser;
  local_d4 = id;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&user.username.field_2 + 8),local_f8,local_f0 + (long)local_f8);
  lVar11 = (long)local_80 - password.field_2._8_8_;
  uVar10 = password.field_2._8_8_;
  if (0 < lVar11 >> 8) {
    lVar14 = (lVar11 >> 8) + 1;
    do {
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
              ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                            *)local_78,
                           (__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>)
                           uVar10);
      pvVar15 = local_38;
      _Var16._M_current = (anon_struct_64_2_84df61a8 *)uVar10;
      if (bVar6) goto LAB_00105eaa;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
              ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                            *)local_78,(anon_struct_64_2_84df61a8 *)(uVar10 + 0x40));
      pvVar15 = local_38;
      _Var16._M_current = (anon_struct_64_2_84df61a8 *)(uVar10 + 0x40);
      if (bVar6) goto LAB_00105eaa;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
              ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                            *)local_78,(anon_struct_64_2_84df61a8 *)(uVar10 + 0x80));
      pvVar15 = local_38;
      _Var16._M_current = (anon_struct_64_2_84df61a8 *)(uVar10 + 0x80);
      if (bVar6) goto LAB_00105eaa;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
              ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                            *)local_78,(anon_struct_64_2_84df61a8 *)(uVar10 + 0xc0));
      pvVar15 = local_38;
      _Var16._M_current = (anon_struct_64_2_84df61a8 *)(uVar10 + 0xc0);
      if (bVar6) goto LAB_00105eaa;
      uVar10 = uVar10 + 0x100;
      lVar14 = lVar14 + -1;
      lVar11 = lVar11 + -0x100;
    } while (1 < lVar14);
  }
  pvVar15 = local_38;
  lVar11 = lVar11 >> 6;
  if (lVar11 == 1) {
LAB_00105e94:
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
            ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                          *)local_78,
                         (__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>)
                         uVar10);
    _Var16._M_current = local_80;
    if (bVar6) {
      _Var16._M_current = (anon_struct_64_2_84df61a8 *)uVar10;
    }
  }
  else if (lVar11 == 2) {
LAB_00105e6b:
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
            ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                          *)local_78,
                         (__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>)
                         uVar10);
    _Var16._M_current = (anon_struct_64_2_84df61a8 *)uVar10;
    if (!bVar6) {
      uVar10 = uVar10 + 0x40;
      goto LAB_00105e94;
    }
  }
  else {
    _Var16._M_current = local_80;
    if ((lVar11 == 3) &&
       (bVar6 = __gnu_cxx::__ops::
                _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                              *)local_78,
                             (__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>)
                             uVar10), _Var16._M_current = (anon_struct_64_2_84df61a8 *)uVar10,
       !bVar6)) {
      uVar10 = uVar10 + 0x40;
      goto LAB_00105e6b;
    }
  }
LAB_00105eaa:
  psVar12 = &user.username._M_string_length;
  if ((uint *)user.username.field_2._8_8_ != local_48) {
    operator_delete((void *)user.username.field_2._8_8_);
  }
  if (local_78 != (undefined1  [8])psVar12) {
    operator_delete((void *)local_78);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  if ((size_type *)username.field_2._8_8_ != local_108) {
    operator_delete((void *)username.field_2._8_8_);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if (local_c8 != (size_type *)&local_b8) {
    operator_delete(local_c8);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0);
  }
  if (_Var16._M_current !=
      users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data._M_start
     ) {
    __it_00._M_current =
         (pvVar15->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
         super__Vector_impl_data._M_start;
    local_80 = (anon_struct_64_2_84df61a8 *)
               (pvVar15->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_158;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               &users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_138._M_p,
               username._M_dataplus._M_p + local_138._M_p);
    local_c8 = (size_type *)&local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,
               users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage,
               (long)&((users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage)->username)._M_dataplus._M_p +
               local_160);
    lVar11 = local_c0;
    local_108[0] = CONCAT44(uStack_b4,local_b8);
    username.field_2._8_8_ = local_c8;
    psVar5 = (size_type *)&local_b8;
    if (local_c8 == (size_type *)&local_b8) {
      username.field_2._8_8_ = local_108;
      psVar5 = local_c8;
    }
    local_c8 = psVar5;
    local_d0 = local_108;
    local_b8 = local_b8 & 0xffffff00;
    local_c0 = 0;
    local_78 = (undefined1  [8])psVar12;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,username.field_2._8_8_,
               (undefined1 *)(lVar11 + username.field_2._8_8_));
    lVar14 = (long)local_80 - (long)__it_00._M_current;
    lVar11 = (lVar14 >> 3) * -0x3333333333333333 >> 2;
    if (0 < lVar11) {
      lVar11 = lVar11 + 1;
      do {
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                              *)local_78,__it_00);
        __it._M_current = __it_00._M_current;
        pvVar15 = local_38;
        if (bVar6) goto LAB_00106183;
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                              *)local_78,__it_00._M_current + 1);
        __it._M_current = __it_00._M_current + 1;
        pvVar15 = local_38;
        if (bVar6) goto LAB_00106183;
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                              *)local_78,__it_00._M_current + 2);
        __it._M_current = __it_00._M_current + 2;
        pvVar15 = local_38;
        if (bVar6) goto LAB_00106183;
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                              *)local_78,__it_00._M_current + 3);
        __it._M_current = __it_00._M_current + 3;
        pvVar15 = local_38;
        if (bVar6) goto LAB_00106183;
        __it_00._M_current = __it_00._M_current + 4;
        lVar11 = lVar11 + -1;
        lVar14 = lVar14 + -0xa0;
      } while (1 < lVar11);
    }
    lVar11 = (lVar14 >> 3) * -0x3333333333333333;
    pvVar15 = local_38;
    if (lVar11 == 1) {
LAB_0010616d:
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
              ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                            *)local_78,__it_00);
      __it._M_current = (anon_struct_40_2_6a8bb0e8 *)local_80;
      if (bVar6) {
        __it._M_current = __it_00._M_current;
      }
    }
    else {
      __it._M_current = __it_00._M_current;
      if (lVar11 == 2) {
LAB_00106140:
        pvVar15 = local_38;
        bVar6 = __gnu_cxx::__ops::
                _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                              *)local_78,__it);
        if (!bVar6) {
          __it_00._M_current = __it._M_current + 1;
          goto LAB_0010616d;
        }
      }
      else {
        __it._M_current = (anon_struct_40_2_6a8bb0e8 *)local_80;
        if ((lVar11 == 3) &&
           (bVar6 = __gnu_cxx::__ops::
                    _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                    ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                  *)local_78,__it_00), __it._M_current = __it_00._M_current,
           pvVar15 = local_38, !bVar6)) {
          __it._M_current = __it_00._M_current + 1;
          goto LAB_00106140;
        }
      }
    }
LAB_00106183:
    if (local_78 != (undefined1  [8])&user.username._M_string_length) {
      operator_delete((void *)local_78);
    }
    if ((size_type *)username.field_2._8_8_ != local_d0) {
      operator_delete((void *)username.field_2._8_8_);
    }
    if (local_c8 != (size_type *)&local_b8) {
      operator_delete(local_c8);
    }
    if (users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (pointer)local_158) {
      operator_delete(users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
    if ((anon_struct_64_2_84df61a8 *)__it._M_current ==
        (anon_struct_64_2_84df61a8 *)
        (pvVar15->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.super__Vector_impl_data
        ._M_finish) {
      sVar7 = send(local_84,"Login Confirmed",0x14,0);
      if (sVar7 == -1) {
        perror("send");
      }
      paVar13 = (pvVar15->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
                super__Vector_impl_data._M_start;
      paVar2 = (pvVar15->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (paVar13 != paVar2) {
        psVar1 = (string *)(username.field_2._M_local_buf + 8);
        do {
          local_78 = (undefined1  [8])&user.username._M_string_length;
          pcVar3 = (paVar13->username)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_78,pcVar3,pcVar3 + (paVar13->username)._M_string_length);
          user.username.field_2._8_4_ = paVar13->id;
          pcVar3 = ((_Var16._M_current)->username)._M_dataplus._M_p;
          username.field_2._8_8_ = local_108;
          std::__cxx11::string::_M_construct<char*>
                    (psVar1,pcVar3,pcVar3 + ((_Var16._M_current)->username)._M_string_length);
          std::__cxx11::string::append((char *)psVar1);
          std::__cxx11::string::operator=
                    ((string *)
                     ((msgs->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + (int)user.username.field_2._8_4_)
                     ,psVar1);
          if ((size_type *)username.field_2._8_8_ != local_108) {
            operator_delete((void *)username.field_2._8_8_);
          }
          *(bool *)(local_158._16_8_ + (long)(int)user.username.field_2._8_4_) = true;
          if (local_78 != (undefined1  [8])&user.username._M_string_length) {
            operator_delete((void *)local_78);
          }
          paVar13 = paVar13 + 1;
        } while (paVar13 != paVar2);
      }
      psVar12 = &user.username._M_string_length;
      pcVar3 = ((_Var16._M_current)->username)._M_dataplus._M_p;
      local_78 = (undefined1  [8])psVar12;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,pcVar3,pcVar3 + ((_Var16._M_current)->username)._M_string_length
                );
      std::__cxx11::string::append(local_78);
      uVar10 = local_158._24_8_;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_78,
                          (long)user.username._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      pvVar15 = local_38;
      if (local_78 != (undefined1  [8])psVar12) {
        operator_delete((void *)local_78);
      }
      std::__cxx11::string::_M_assign((string *)uVar10);
      user.username._M_string_length = 0;
      user.username.field_2._M_allocated_capacity = 0;
      user.username.field_2._8_8_ = 0;
      user.username._M_dataplus._M_p = (pointer)0x0;
      local_78 = (undefined1  [8])psVar12;
      std::vector<cUser,_std::allocator<cUser>_>::emplace_back<cUser>
                (pvVar15,(anon_struct_40_2_6a8bb0e8 *)local_78);
      if (local_78 != (undefined1  [8])psVar12) {
        operator_delete((void *)local_78);
      }
      std::__cxx11::string::_M_assign
                ((string *)
                 ((pvVar15->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
                  super__Vector_impl_data._M_finish + -1));
      (pvVar15->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.super__Vector_impl_data.
      _M_finish[-1].id = local_d4;
      iVar9 = 1;
      goto LAB_0010642a;
    }
    sVar7 = send(local_84,"User is already logged in",0x1e,0);
    if (sVar7 == -1) {
      perror("user already logged in");
    }
  }
  sVar7 = send(local_84,"Invalid Username or Password",0x28,0);
  if (sVar7 == -1) {
    perror("send");
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Invalid username or password",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  iVar9 = 0;
  std::ostream::flush();
LAB_0010642a:
  std::vector<User,_std::allocator<User>_>::~vector
            ((vector<User,_std::allocator<User>_> *)((long)&password.field_2 + 8));
  if (local_1a0 != &password._M_string_length) {
    operator_delete(local_1a0);
  }
  if ((size_type *)local_138._M_p != &username._M_string_length) {
    operator_delete(local_138._M_p);
  }
  return iVar9;
}

Assistant:

int login(string cmd, int socket_fd, string* currUser,vector<cUser>& currUsers,
    int id, bool* msgFlags, vector<string>& msgs){

    string username;
    string password;
    char command[MAXDATASIZE];
    int numbytes = 0;

    //get the current user's usernames and passwords from the userfile
    vector<User> users = getUsers();

    //parse the command string given to the function
    //if no sername or password this step will catch that and not error out
    size_t spacePos = cmd.find(" ");
    username = cmd.substr(0,spacePos);
    password = cmd.substr(spacePos+1);


    //search through all the users and check for usersname and password
    auto it = find_if(users.begin(),users.end(),[username,password](User u){
        return (u.username == username && u.password == password);
    });

    //if the find function found a match, then add the users name and
    // send confirmation
    if(it != users.end()){
        auto currUsersIt = find_if(currUsers.begin(),currUsers.end(),[username](cUser u){
            return (u.username == username);
        });

        //check if the user is already logged in
        if(currUsersIt == currUsers.end()){

            if(send(socket_fd, "Login Confirmed",20,0) == -1)
                perror("send");

            //broadcast the user has joined
            for(cUser user : currUsers){
                msgs[user.id] = string(it->username + " has joined");
                msgFlags[user.id] = true;
            }

            cout << it->username + " Login." << endl;

            //add evertyhing to the currently logged in users list
            *currUser = it->username;
            currUsers.push_back(cUser());
            currUsers.back().username = it->username;
            currUsers.back().id = id;

            return 1;
        }
        else{
            if(send(socket_fd, "User is already logged in",30,0) == -1)
                perror("user already logged in");
        }

    }

    //otherwise error
    if(send(socket_fd, "Invalid Username or Password",40,0) == -1)
        perror("send");
    cout << "Invalid username or password" << endl;

    return 0;

}